

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

basic_appender<char>
fmt::v11::detail::write_int<fmt::v11::basic_appender<char>,unsigned_long,char>
          (basic_appender<char> out,unsigned_long value,uint prefix,format_specs *specs,
          digit_grouping<char> *grouping)

{
  char *pcVar1;
  byte bVar2;
  long lVar3;
  uint uVar4;
  char *pcVar5;
  byte *pbVar6;
  basic_appender<char> bVar7;
  char *pcVar8;
  unsigned_long uVar9;
  byte *pbVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  size_t sVar15;
  size_t n;
  bool bVar16;
  memory_buffer buffer;
  uint local_294;
  basic_appender<char> local_290;
  anon_class_24_3_e2c60416 local_288 [2];
  memory_buffer local_248;
  
  pcVar1 = local_248.store_;
  local_248.super_buffer<char>.size_ = 0;
  local_248.super_buffer<char>.grow_ =
       basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  local_248.super_buffer<char>.capacity_ = 500;
  uVar14 = (specs->super_basic_specs).data_;
  local_294 = prefix;
  local_248.super_buffer<char>.ptr_ = pcVar1;
  switch(uVar14 & 7) {
  case 4:
    if ((uVar14 >> 0xd & 1) != 0) {
      uVar4 = (uint)((uVar14 >> 0xc & 1) == 0) << 0xd | 0x5830;
      uVar12 = uVar4 << 8;
      if (prefix == 0) {
        uVar12 = uVar4;
      }
      local_294 = (uVar12 | prefix) + 0x2000000;
    }
    uVar9 = value;
    n = 0;
    do {
      sVar15 = n;
      n = sVar15 + 1;
      bVar16 = 0xf < uVar9;
      uVar9 = uVar9 >> 4;
    } while (bVar16);
    local_290.container = out.container;
    pcVar5 = to_pointer<char>(&local_248.super_buffer<char>,n);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = (char *)((long)&local_288[0].prefix + sVar15);
      pcVar8 = "0123456789ABCDEF";
      if ((uVar14 >> 0xc & 1) == 0) {
        pcVar8 = "0123456789abcdef";
      }
      do {
        *pcVar5 = pcVar8[(uint)value & 0xf];
        pcVar5 = pcVar5 + -1;
        bVar16 = 0xf < value;
        value = value >> 4;
      } while (bVar16);
      copy_noinline<char,char*,fmt::v11::basic_appender<char>>
                ((char *)local_288,(char *)((long)&local_288[0].prefix + sVar15 + 1),
                 &local_248.super_buffer<char>);
    }
    else {
      pcVar8 = "0123456789ABCDEF";
      if ((uVar14 >> 0xc & 1) == 0) {
        pcVar8 = "0123456789abcdef";
      }
      pcVar5 = pcVar5 + n;
      do {
        pcVar5 = pcVar5 + -1;
        *pcVar5 = pcVar8[(uint)value & 0xf];
        bVar16 = 0xf < value;
        value = value >> 4;
      } while (bVar16);
    }
    break;
  case 5:
    uVar9 = value;
    n = 0;
    do {
      sVar15 = n;
      n = sVar15 + 1;
      bVar16 = 7 < uVar9;
      uVar9 = uVar9 >> 3;
    } while (bVar16);
    if ((((uVar14 >> 0xd & 1) != 0) && (value != 0)) && (specs->precision <= (int)n)) {
      uVar14 = 0x3000;
      if (prefix == 0) {
        uVar14 = 0x30;
      }
      local_294 = (uVar14 | prefix) + 0x1000000;
    }
    local_290.container = out.container;
    pcVar5 = to_pointer<char>(&local_248.super_buffer<char>,n);
    if (pcVar5 == (char *)0x0) {
      pbVar6 = (byte *)((long)&local_288[0].prefix + sVar15);
      do {
        *pbVar6 = (byte)value & 7 | 0x30;
        pbVar6 = pbVar6 + -1;
        bVar16 = 7 < value;
        value = value >> 3;
      } while (bVar16);
      copy_noinline<char,char*,fmt::v11::basic_appender<char>>
                ((char *)local_288,(char *)((long)&local_288[0].prefix + sVar15 + 1),
                 &local_248.super_buffer<char>);
    }
    else {
      pbVar6 = (byte *)(pcVar5 + n);
      do {
        pbVar6 = pbVar6 + -1;
        *pbVar6 = (byte)value & 7 | 0x30;
        bVar16 = 7 < value;
        value = value >> 3;
      } while (bVar16);
    }
    break;
  case 6:
    if ((uVar14 >> 0xd & 1) != 0) {
      uVar12 = (uint)((uVar14 >> 0xc & 1) == 0) << 0xd | 0x4230;
      uVar14 = uVar12 << 8;
      if (prefix == 0) {
        uVar14 = uVar12;
      }
      local_294 = (uVar14 | prefix) + 0x2000000;
    }
    uVar9 = value;
    n = 0;
    do {
      sVar15 = n;
      n = sVar15 + 1;
      bVar16 = 1 < uVar9;
      uVar9 = uVar9 >> 1;
    } while (bVar16);
    local_290.container = out.container;
    pcVar5 = to_pointer<char>(&local_248.super_buffer<char>,n);
    if (pcVar5 == (char *)0x0) {
      pbVar6 = (byte *)((long)&local_288[0].prefix + sVar15);
      do {
        *pbVar6 = (byte)value & 1 | 0x30;
        pbVar6 = pbVar6 + -1;
        bVar16 = 1 < value;
        value = value >> 1;
      } while (bVar16);
      copy_noinline<char,char*,fmt::v11::basic_appender<char>>
                ((char *)local_288,(char *)((long)&local_288[0].prefix + sVar15 + 1),
                 &local_248.super_buffer<char>);
    }
    else {
      pbVar6 = (byte *)(pcVar5 + n);
      do {
        pbVar6 = pbVar6 + -1;
        *pbVar6 = (byte)value & 1 | 0x30;
        bVar16 = 1 < value;
        value = value >> 1;
      } while (bVar16);
    }
    break;
  case 7:
    local_288[0].prefix._0_2_ = CONCAT11((char)value,(uVar14 & 7) == 1);
    bVar7 = write_padded<char,(fmt::v11::align)1,fmt::v11::basic_appender<char>,fmt::v11::detail::write_char<char,fmt::v11::basic_appender<char>>(fmt::v11::basic_appender<char>,char,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                      (out,specs,1,1,(anon_class_2_2_bf5026b7 *)local_288);
    goto LAB_0015e199;
  default:
    lVar3 = 0x3f;
    if ((value | 1) != 0) {
      for (; (value | 1) >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    uVar14 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar3] -
             (uint)(value < *(ulong *)(do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                                      (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar3]
                                      * 8));
    n = (size_t)uVar14;
    local_290.container = out.container;
    format_decimal<char,_unsigned_long,_fmt::v11::basic_appender<char>,_0>
              (&local_248.super_buffer<char>,value,uVar14);
  }
  pbVar6 = (byte *)(grouping->grouping_)._M_dataplus._M_p;
  pbVar10 = pbVar6 + (grouping->grouping_)._M_string_length;
  uVar14 = ((local_294 >> 0x18) + (int)n) - 1;
  iVar11 = 0;
  do {
    iVar13 = 0x7fffffff;
    if ((grouping->thousands_sep_)._M_string_length != 0) {
      if (pbVar6 == pbVar10) {
        uVar12 = (uint)(char)pbVar10[-1];
      }
      else {
        bVar2 = *pbVar6;
        if ((byte)(bVar2 + 0x81) < 0x82) goto LAB_0015e166;
        pbVar6 = pbVar6 + 1;
        uVar12 = (uint)bVar2;
      }
      iVar11 = iVar11 + uVar12;
      iVar13 = iVar11;
    }
LAB_0015e166:
    uVar14 = uVar14 + 1;
  } while (iVar13 < (int)n);
  local_288[0].prefix = &local_294;
  local_288[0].buffer = &local_248;
  local_288[0].grouping = grouping;
  bVar7 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_int<fmt::v11::basic_appender<char>,unsigned_long,char>(fmt::v11::basic_appender<char>,unsigned_long,unsigned_int,fmt::v11::format_specs_const&,fmt::v11::detail::digit_grouping<char>const&)::_lambda(fmt::v11::basic_appender<char>)_1_>
                    (local_290,specs,(ulong)uVar14,(ulong)uVar14,local_288);
LAB_0015e199:
  if (local_248.super_buffer<char>.ptr_ != pcVar1) {
    free(local_248.super_buffer<char>.ptr_);
  }
  return (basic_appender<char>)bVar7.container;
}

Assistant:

auto write_int(OutputIt out, UInt value, unsigned prefix,
               const format_specs& specs, const digit_grouping<Char>& grouping)
    -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = 0;
  auto buffer = memory_buffer();
  switch (specs.type()) {
  default: FMT_ASSERT(false, ""); FMT_FALLTHROUGH;
  case presentation_type::none:
  case presentation_type::dec:
    num_digits = count_digits(value);
    format_decimal<char>(appender(buffer), value, num_digits);
    break;
  case presentation_type::hex:
    if (specs.alt())
      prefix_append(prefix, unsigned(specs.upper() ? 'X' : 'x') << 8 | '0');
    num_digits = count_digits<4>(value);
    format_base2e<char>(4, appender(buffer), value, num_digits, specs.upper());
    break;
  case presentation_type::oct:
    num_digits = count_digits<3>(value);
    // Octal prefix '0' is counted as a digit, so only add it if precision
    // is not greater than the number of digits.
    if (specs.alt() && specs.precision <= num_digits && value != 0)
      prefix_append(prefix, '0');
    format_base2e<char>(3, appender(buffer), value, num_digits);
    break;
  case presentation_type::bin:
    if (specs.alt())
      prefix_append(prefix, unsigned(specs.upper() ? 'B' : 'b') << 8 | '0');
    num_digits = count_digits<1>(value);
    format_base2e<char>(1, appender(buffer), value, num_digits);
    break;
  case presentation_type::chr:
    return write_char<Char>(out, static_cast<Char>(value), specs);
  }

  unsigned size = (prefix != 0 ? prefix >> 24 : 0) + to_unsigned(num_digits) +
                  to_unsigned(grouping.count_separators(num_digits));
  return write_padded<Char, align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        for (unsigned p = prefix & 0xffffff; p != 0; p >>= 8)
          *it++ = static_cast<Char>(p & 0xff);
        return grouping.apply(it, string_view(buffer.data(), buffer.size()));
      });
}